

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack9_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  
  auVar9 = *(undefined1 (*) [16])(in + 1);
  auVar13 = vpmovsxbd_avx512f(_DAT_00199500);
  uVar1 = *in;
  auVar14 = vbroadcasti64x4_avx512f(_DAT_0018d760);
  uVar3 = *(ulong *)(in + 5);
  auVar4 = vpmovsxbd_avx2(ZEXT816(0xf00000100000000));
  auVar8 = vpsllvd_avx2(auVar9,_DAT_001994a0);
  auVar8 = vpand_avx(auVar8,_DAT_001994b0);
  *out = uVar1 & 0x1ff;
  uVar2 = in[7];
  auVar13 = vpermi2d_avx512f(auVar13,ZEXT1664(auVar9),ZEXT464(uVar1));
  auVar13 = vpsrlvd_avx512f(auVar13,_DAT_001ab300);
  auVar15 = vpbroadcastd_avx512f(ZEXT416(0x1ff));
  auVar14 = vpermd_avx512f(auVar14,ZEXT1664(auVar8));
  auVar16 = vpandd_avx512f(auVar13,auVar15);
  auVar13 = vpord_avx512f(auVar13,auVar14);
  auVar14._0_8_ = auVar16._0_8_;
  auVar14._8_4_ = auVar13._8_4_;
  auVar14._12_4_ = auVar16._12_4_;
  auVar14._16_4_ = auVar16._16_4_;
  auVar14._20_4_ = auVar16._20_4_;
  auVar14._24_4_ = auVar13._24_4_;
  auVar14._28_4_ = auVar16._28_4_;
  auVar14._32_4_ = auVar16._32_4_;
  auVar14._36_4_ = auVar13._36_4_;
  auVar14._40_4_ = auVar16._40_4_;
  auVar14._44_4_ = auVar16._44_4_;
  auVar14._48_4_ = auVar16._48_4_;
  auVar14._52_4_ = auVar13._52_4_;
  auVar14._56_4_ = auVar16._56_4_;
  auVar14._60_4_ = auVar16._60_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar3;
  auVar8 = vpsllvd_avx2(auVar17,_DAT_001994c0);
  auVar9 = vpalignr_avx(auVar17,auVar9,0xc);
  auVar11 = vpmovsxbd_avx2(ZEXT816(0x302020101010100));
  auVar5._8_4_ = 0x180;
  auVar5._0_8_ = 0x1f800000180;
  auVar5._12_4_ = 0x1f8;
  auVar8 = vpandq_avx512vl(auVar8,auVar5);
  auVar13 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])(out + 1) = auVar13;
  auVar10 = vpbroadcastd_avx512vl();
  uVar1 = in[8];
  auVar9 = vpinsrd_avx(auVar9,uVar2 << 8,3);
  auVar11 = vpermd_avx2(auVar11,ZEXT1632(auVar9));
  auVar6 = vpsrlvd_avx2(auVar11,_DAT_00196240);
  auVar12._8_4_ = 0x100;
  auVar12._0_8_ = 0x10000000100;
  auVar12._12_4_ = 0x100;
  auVar12._16_4_ = 0x100;
  auVar12._20_4_ = 0x100;
  auVar12._24_4_ = 0x100;
  auVar12._28_4_ = 0x100;
  auVar11 = vpandd_avx512vl(auVar11,auVar12);
  auVar12 = vpermi2d_avx512vl(auVar4,ZEXT1632(auVar8),auVar10);
  auVar11 = vpblendd_avx2(auVar6,auVar11,0x80);
  auVar4 = vpand_avx2(auVar6,auVar15._0_32_);
  auVar11 = vpor_avx2(auVar11,auVar12);
  auVar4 = vpblendd_avx2(auVar4,auVar11,0x91);
  *(undefined1 (*) [32])(out + 0x11) = auVar4;
  auVar9 = vpinsrd_avx(ZEXT416(uVar2),uVar1 << 4,1);
  auVar17 = auVar15._0_16_;
  auVar8 = vpinsrd_avx(auVar17,uVar2 >> 0x1c,3);
  auVar9 = vpshufd_avx(auVar9,0x40);
  auVar5 = vpsrlvd_avx2(auVar9,_DAT_001994e0);
  auVar7._8_4_ = 0x1f0;
  auVar7._0_8_ = 0x1f0000001f0;
  auVar7._12_4_ = 0x1f0;
  auVar8 = vpternlogd_avx512vl(auVar8,auVar9,auVar7,0xf8);
  auVar9 = vpand_avx(auVar5,auVar17);
  auVar9 = vpblendd_avx2(auVar9,auVar8,8);
  *(undefined1 (*) [16])(out + 0x19) = auVar9;
  auVar9 = vpbroadcastd_avx512vl();
  auVar9 = vpsrlvd_avx2(auVar9,_DAT_001994f0);
  auVar9 = vpand_avx(auVar9,auVar17);
  *(long *)(out + 0x1d) = auVar9._0_8_;
  out[0x1f] = uVar1 >> 0x17;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack9_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 9);
  out++;
  *out = ((*in) >> 9) % (1U << 9);
  out++;
  *out = ((*in) >> 18) % (1U << 9);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 4)) << (9 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 9);
  out++;
  *out = ((*in) >> 13) % (1U << 9);
  out++;
  *out = ((*in) >> 22) % (1U << 9);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 8)) << (9 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 9);
  out++;
  *out = ((*in) >> 17) % (1U << 9);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 3)) << (9 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 9);
  out++;
  *out = ((*in) >> 12) % (1U << 9);
  out++;
  *out = ((*in) >> 21) % (1U << 9);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 7)) << (9 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 9);
  out++;
  *out = ((*in) >> 16) % (1U << 9);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 2)) << (9 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 9);
  out++;
  *out = ((*in) >> 11) % (1U << 9);
  out++;
  *out = ((*in) >> 20) % (1U << 9);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 6)) << (9 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 9);
  out++;
  *out = ((*in) >> 15) % (1U << 9);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 1)) << (9 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 9);
  out++;
  *out = ((*in) >> 10) % (1U << 9);
  out++;
  *out = ((*in) >> 19) % (1U << 9);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 5)) << (9 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 9);
  out++;
  *out = ((*in) >> 14) % (1U << 9);
  out++;
  *out = ((*in) >> 23);
  ++in;
  out++;

  return in;
}